

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

void __thiscall DomLayoutItem::clear(DomLayoutItem *this)

{
  DomWidget *this_00;
  DomLayout *this_01;
  DomSpacer *this_02;
  
  this_00 = this->m_widget;
  if (this_00 != (DomWidget *)0x0) {
    DomWidget::~DomWidget(this_00);
    operator_delete(this_00,0x160);
  }
  this_01 = this->m_layout;
  if (this_01 != (DomLayout *)0x0) {
    DomLayout::~DomLayout(this_01);
    operator_delete(this_01,0x128);
  }
  this_02 = this->m_spacer;
  if (this_02 != (DomSpacer *)0x0) {
    DomSpacer::~DomSpacer(this_02);
    operator_delete(this_02,0x38);
  }
  this->m_layout = (DomLayout *)0x0;
  this->m_spacer = (DomSpacer *)0x0;
  *(undefined8 *)&this->m_kind = 0;
  *(undefined8 *)((long)&this->m_widget + 4) = 0;
  return;
}

Assistant:

void DomLayoutItem::clear()
{
    delete m_widget;
    delete m_layout;
    delete m_spacer;

    m_kind = Unknown;

    m_widget = nullptr;
    m_layout = nullptr;
    m_spacer = nullptr;
}